

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O0

size_t * IsoSpec::get_inverse_order<double>(double *order_array,size_t N)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  unsigned_long *in_RSI;
  unsigned_long *in_RDI;
  anon_class_8_1_86301488 unaff_retaddr;
  size_t ii;
  size_t *arr;
  unsigned_long *local_20;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  psVar3 = (size_t *)operator_new__(uVar2);
  for (local_20 = (unsigned_long *)0x0; local_20 < in_RSI;
      local_20 = (unsigned_long *)((long)local_20 + 1)) {
    psVar3[(long)local_20] = (size_t)local_20;
  }
  std::
  sort<unsigned_long*,IsoSpec::get_inverse_order<double>(double*,unsigned_long)::_lambda(int,int)_1_>
            (in_RDI,in_RSI,unaff_retaddr);
  return psVar3;
}

Assistant:

size_t* get_inverse_order(T* order_array, size_t N)
{
    size_t* arr = new size_t[N];
    for(size_t ii = 0; ii < N; ii++)
        arr[ii] = ii;

    std::sort(arr, arr + N, [&](int i, int j) { return order_array[i] > order_array[j]; });

    return arr;
}